

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void reshade(bool keep)

{
  uint y;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  float *pfVar6;
  clock_t cVar7;
  size_type __n;
  int iVar8;
  undefined1 *puVar9;
  undefined7 in_register_00000039;
  int j;
  Vector3f *pVVar10;
  int x;
  size_type sVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  Camera *camera;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> v;
  int local_a4;
  size_type local_98;
  void *local_88;
  undefined1 local_78 [24];
  _Map_pointer local_60;
  undefined1 *local_58;
  Camera *local_50;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> local_48;
  
  iVar2 = cnt + 1;
  cnt = 1;
  if ((int)CONCAT71(in_register_00000039,keep) != 0) {
    cnt = iVar2;
  }
  local_50 = scene.camera;
  iVar2 = (scene.camera)->width;
  __n = (size_type)iVar2;
  y = (scene.camera)->height;
  if (y * iVar2 == 0) {
    local_88 = (void *)0x0;
  }
  else {
    local_88 = malloc((long)(int)(y * iVar2 * 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"shading start (",0xf);
  poVar5 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,cnt);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_60 = (_Map_pointer)clock();
  if (!keep && 0 < iVar2) {
    puVar9 = tot;
    sVar11 = 0;
    do {
      pVVar10 = (Vector3f *)puVar9;
      uVar13 = (ulong)y;
      if (0 < (int)y) {
        do {
          Vector3f::operator=(pVVar10,&Vector3f::ZERO);
          pVVar10 = pVVar10 + 1;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      sVar11 = sVar11 + 1;
      puVar9 = (undefined1 *)((long)puVar9 + 24000);
    } while (sVar11 != __n);
  }
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::vector
            ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)(local_78 + 0x30),__n
             ,(allocator_type *)local_78);
  local_a4 = 0;
  if (0 < iVar2) {
    do {
      ThreadPool::enqueue<bool(&)(Camera*,int),Camera*&,int&>
                ((ThreadPool *)local_78,(_func_bool_Camera_ptr_int *)pool,(Camera **)execute,
                 (int *)(local_78 + 0x28));
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&((_Function_base *)
                      &(local_48.
                        super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->super___basic_future<bool>)->
                      _M_functor + (long)local_a4 * 0x10 + 8);
      (&((_Function_base *)
        &(local_48.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
          _M_impl.super__Vector_impl_data._M_start)->super___basic_future<bool>)->_M_functor)
      [local_a4] = (_Any_data)local_78._0_16_;
      local_78._0_16_ = ZEXT816(0) << 0x40;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
      local_a4 = local_a4 + 1;
    } while (local_a4 < iVar2);
    if (0 < iVar2) {
      lVar12 = 0;
      do {
        std::future<bool>::get
                  ((future<bool> *)
                   ((long)&((_Function_base *)
                           &(local_48.
                             super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super___basic_future<bool>)
                           ->_M_functor + lVar12));
        lVar12 = lVar12 + 0x10;
      } while (__n << 4 != lVar12);
      if (0 < iVar2) {
        iVar4 = 0;
        local_98 = 0;
        do {
          if (0 < (int)y) {
            uVar13 = 0;
            local_58 = tot + local_98 * 24000;
            iVar8 = iVar4;
            do {
              lVar12 = 0;
              pVVar10 = (Vector3f *)(local_58 + uVar13 * 0xc);
              do {
                pfVar6 = Vector3f::operator[](pVVar10,(int)lVar12);
                uVar3 = (uint)((*pfVar6 / (float)cnt) * 255.0);
                uVar3 = ~((int)uVar3 >> 0x1f) & uVar3;
                uVar1 = (undefined1)uVar3;
                if (0xfe < (int)uVar3) {
                  uVar1 = 0xff;
                }
                *(undefined1 *)((long)local_88 + lVar12 + iVar8) = uVar1;
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              iVar8 = iVar8 + iVar2 * 3;
              uVar13 = uVar13 + 1;
            } while (uVar13 != y);
          }
          local_98 = local_98 + 1;
          iVar4 = iVar4 + 3;
        } while (local_98 != __n);
      }
    }
  }
  cVar7 = clock();
  stbi_write_bmp("output.bmp",iVar2,y,3,local_88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"end shading ",0xc);
  dVar14 = (double)(cVar7 - (long)local_60) / 1000000.0;
  poVar5 = std::ostream::_M_insert<double>(dVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s    ",5);
  poVar5 = std::ostream::_M_insert<double>(1.0 / dVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"fps\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"time passed: ",0xd);
  poVar5 = std::ostream::_M_insert<double>((double)cVar7 / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s\n",2);
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector
            ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)(local_78 + 0x30));
  return;
}

Assistant:

void reshade(bool keep)
{
	if (!keep) cnt = 1; else ++cnt;
	unsigned char* img = 0; int ls = 0;
	Camera* camera = scene.camera;
	int w = camera->getWidth(), h = camera->getHeight(), s = w * h * 3;
	if (s != ls) free(img), img = (unsigned char* )malloc(sizeof(unsigned char) * (ls=s));
	std::cerr << "shading start (" << keep << "," << cnt << ")" << std::endl;
	time_t t1 = clock();
	if (!keep)
		for (int x = 0; x < w; ++x)
			for (int y = 0; y < h; ++y)
				tot[x][y] = Vector3f::ZERO;
	std::vector<std::future<bool>> v(w);
	for (int x = 0; x < w; ++x)
		v[x]=pool->enqueue(execute, camera, x);
	for (int x = 0; x < w; ++x) v[x].get();
	for (int x = 0; x < w; ++x)
		for (int y = 0; y < h; ++y)
		{
			for (int j = 0; j < 3; ++j)
			{
				int ww = tot[x][y][j] / cnt * 255;
				if (ww < 0) ww = 0;
				if (ww > 255) ww = 255;
				img[x * 3 + y * w * 3 + j] = ww;
			}
		}
	time_t t2 = clock();
	stbi_write_bmp("output.bmp", w, h, 3, img);
	std::cerr << "end shading " << (t2 - t1) * 1.0 / CLOCKS_PER_SEC << "s    " << 1.0 / ((t2 - t1) * 1.0 / CLOCKS_PER_SEC) << "fps\n";
	std::cerr << "time passed: " << t2 * 1.0 / CLOCKS_PER_SEC << "s\n";
}